

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

int absl::lts_20250127::crc_internal::CRCImpl::FillZeroesTable(uint32_t poly,Uint32By256 *t)

{
  bool bVar1;
  int i;
  int iVar2;
  long lVar3;
  long lVar4;
  CRCImpl *__s;
  undefined **ppuVar5;
  uint uVar6;
  uint uVar7;
  uint64_t inc_len;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t l;
  uint uVar12;
  
  iVar2 = 0;
  uVar7 = 0x40000000;
  do {
    uVar6 = 0;
    uVar10 = 0x80000000;
    uVar9 = uVar7;
    do {
      uVar11 = uVar10 & uVar7;
      if ((uVar10 & uVar7) != 0) {
        uVar11 = uVar9;
      }
      uVar6 = uVar6 ^ uVar11;
      uVar9 = uVar9 >> 1 ^ -(uVar9 & 1) & poly;
      bVar1 = 1 < uVar10;
      uVar10 = uVar10 >> 1;
    } while (bVar1);
    iVar2 = iVar2 + 1;
    uVar7 = uVar6;
  } while (iVar2 != 3);
  lVar8 = 1;
  lVar3 = 0;
  do {
    iVar2 = 1;
    lVar3 = (long)(int)lVar3;
    uVar7 = uVar6;
    do {
      lVar4 = lVar3;
      (*t)[lVar4] = uVar7;
      uVar11 = 0;
      uVar10 = 0x80000000;
      uVar9 = uVar6;
      do {
        uVar12 = uVar10 & uVar7;
        if ((uVar10 & uVar7) != 0) {
          uVar12 = uVar9;
        }
        uVar11 = uVar11 ^ uVar12;
        uVar9 = uVar9 >> 1 ^ -(uVar9 & 1) & poly;
        bVar1 = 1 < uVar10;
        uVar10 = uVar10 >> 1;
      } while (bVar1);
      lVar3 = lVar4 + 1;
      iVar2 = iVar2 + 1;
      uVar7 = uVar11;
    } while (iVar2 != 0x10);
    lVar8 = lVar8 << 4;
    uVar6 = uVar11;
  } while (lVar8 != 0);
  if (lVar4 < 0x100) {
    return (int)lVar3;
  }
  FillZeroesTable();
  __s = TryNewCRC32AcceleratedX86ARMCombined();
  if (__s == (CRCImpl *)0x0) {
    __s = (CRCImpl *)operator_new(0x2008);
    memset(__s,0,0x2008);
    ppuVar5 = &PTR__CRC_0056ec30;
    (__s->super_CRC)._vptr_CRC = (_func_int **)&PTR__CRC_0056ec30;
  }
  else {
    ppuVar5 = (__s->super_CRC)._vptr_CRC;
  }
  (*((_func_int **)ppuVar5)[7])(__s);
  return (int)__s;
}

Assistant:

int CRCImpl::FillZeroesTable(uint32_t poly, Uint32By256* t) {
  uint32_t inc = 1;
  inc <<= 31;

  // Extend by one zero bit. We know degree > 1 so (inc & 1) == 0.
  inc >>= 1;

  // Now extend by 2, 4, and 8 bits, so now `inc` is extended by one zero byte.
  for (int i = 0; i < 3; ++i) {
    PolyMultiply(&inc, inc, poly);
  }

  int j = 0;
  for (uint64_t inc_len = 1; inc_len != 0; inc_len <<= ZEROES_BASE_LG) {
    // Every entry in the table adds an additional inc_len zeroes.
    uint32_t v = inc;
    for (int a = 1; a != ZEROES_BASE; a++) {
      t[0][j] = v;
      PolyMultiply(&v, inc, poly);
      j++;
    }
    inc = v;
  }
  ABSL_RAW_CHECK(j <= 256, "");
  return j;
}